

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O1

ImGuiStoragePair * __thiscall
ImVector<ImGuiStorage::ImGuiStoragePair>::insert
          (ImVector<ImGuiStorage::ImGuiStoragePair> *this,ImGuiStoragePair *it,ImGuiStoragePair *v)

{
  int *piVar1;
  undefined8 *puVar2;
  int iVar3;
  ImGuiStoragePair *pIVar4;
  anon_union_8_3_a9ee5d6f_for_ImGuiStoragePair_1 aVar5;
  ImGuiStoragePair *__dest;
  int iVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  
  lVar8 = (long)it - (long)this->Data;
  iVar3 = this->Capacity;
  if (this->Size == iVar3) {
    iVar9 = this->Size + 1;
    if (iVar3 == 0) {
      iVar6 = 8;
    }
    else {
      iVar6 = iVar3 / 2 + iVar3;
    }
    if (iVar9 < iVar6) {
      iVar9 = iVar6;
    }
    if (iVar3 < iVar9) {
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      __dest = (ImGuiStoragePair *)(*GImAllocatorAllocFunc)((long)iVar9 << 4,GImAllocatorUserData);
      if (this->Data != (ImGuiStoragePair *)0x0) {
        memcpy(__dest,this->Data,(long)this->Size << 4);
        pIVar4 = this->Data;
        if ((pIVar4 != (ImGuiStoragePair *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(pIVar4,GImAllocatorUserData);
      }
      this->Data = __dest;
      this->Capacity = iVar9;
    }
  }
  lVar7 = (long)this->Size - (lVar8 >> 4);
  if (lVar7 != 0 && lVar8 >> 4 <= (long)this->Size) {
    memmove((void *)((long)this->Data + lVar8 + 0x10),(void *)((long)this->Data + lVar8),
            lVar7 * 0x10);
  }
  aVar5 = v->field_1;
  puVar2 = (undefined8 *)((long)this->Data + lVar8);
  *puVar2 = *(undefined8 *)v;
  *(anon_union_8_3_a9ee5d6f_for_ImGuiStoragePair_1 *)(puVar2 + 1) = aVar5;
  this->Size = this->Size + 1;
  return (ImGuiStoragePair *)(lVar8 + (long)this->Data);
}

Assistant:

inline T*           insert(const T* it, const T& v)     { IM_ASSERT(it >= Data && it <= Data + Size); const ptrdiff_t off = it - Data; if (Size == Capacity) reserve(_grow_capacity(Size + 1)); if (off < (int)Size) memmove(Data + off + 1, Data + off, ((size_t)Size - (size_t)off) * sizeof(T)); memcpy(&Data[off], &v, sizeof(v)); Size++; return Data + off; }